

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::partitionRefinement()::__1>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8991fb9c comp)

{
  HighsInt *pHVar1;
  HighsInt v1;
  bool bVar2;
  HighsInt *pHVar3;
  long lVar4;
  HighsInt *pHVar5;
  ulong uVar6;
  bool bVar7;
  anon_class_8_1_8991fb9c local_48;
  ulong local_40;
  HighsInt *local_38;
  
  if (begin._M_current == end._M_current) {
LAB_002f973c:
    bVar7 = true;
  }
  else {
    uVar6 = 0;
    local_48.this = comp.this;
    local_38 = begin._M_current;
    do {
      lVar4 = -(long)begin._M_current;
      pHVar3 = begin._M_current;
      do {
        begin._M_current = pHVar3 + 1;
        bVar7 = begin._M_current == end._M_current;
        if (bVar7) goto LAB_002f973c;
        bVar2 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                          (&local_48,pHVar3[1],*pHVar3);
        lVar4 = lVar4 + -4;
        pHVar3 = begin._M_current;
      } while (!bVar2);
      v1 = *begin._M_current;
      local_40 = uVar6;
      do {
        pHVar1 = pHVar3 + -1;
        *pHVar3 = pHVar3[-1];
        pHVar5 = local_38;
        if (pHVar1 == local_38) break;
        bVar2 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                          (&local_48,v1,pHVar3[-2]);
        pHVar3 = pHVar1;
        pHVar5 = pHVar1;
      } while (bVar2);
      *pHVar5 = v1;
      uVar6 = local_40 + (-(lVar4 + (long)pHVar5) >> 2);
    } while (uVar6 < 9);
  }
  return bVar7;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }